

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DebugInfoManager::AnalyzeDebugInsts(DebugInfoManager *this,Module *module)

{
  bool bVar1;
  Instruction *pIVar2;
  IRContext *pIVar3;
  Instruction *pIVar4;
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  anon_class_8_1_8991fb9c local_40;
  function<void_(spvtools::opt::Instruction_*)> local_38;
  Module *local_18;
  Module *module_local;
  DebugInfoManager *this_local;
  
  this->deref_operation_ = (Instruction *)0x0;
  this->debug_info_none_inst_ = (Instruction *)0x0;
  this->empty_debug_expr_inst_ = (Instruction *)0x0;
  local_40.this = this;
  local_18 = module;
  module_local = (Module *)this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::analysis::DebugInfoManager::AnalyzeDebugInsts(spvtools::opt::Module&)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_38,&local_40);
  Module::ForEachInst(module,&local_38,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_38);
  if ((this->empty_debug_expr_inst_ != (Instruction *)0x0) &&
     (pIVar2 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::PreviousNode
                         (&this->empty_debug_expr_inst_->
                           super_IntrusiveNodeBase<spvtools::opt::Instruction>),
     pIVar2 != (Instruction *)0x0)) {
    pIVar2 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::PreviousNode
                       (&this->empty_debug_expr_inst_->
                         super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    bVar1 = opt::Instruction::IsCommonDebugInstr(pIVar2);
    if (bVar1) {
      pIVar2 = this->empty_debug_expr_inst_;
      pIVar3 = context(this);
      IRContext::module(pIVar3);
      Module::ext_inst_debuginfo_begin((Module *)local_48);
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)local_48);
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                (&pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>,pIVar4);
    }
  }
  if ((this->debug_info_none_inst_ != (Instruction *)0x0) &&
     (pIVar2 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::PreviousNode
                         (&this->debug_info_none_inst_->
                           super_IntrusiveNodeBase<spvtools::opt::Instruction>),
     pIVar2 != (Instruction *)0x0)) {
    pIVar2 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::PreviousNode
                       (&this->debug_info_none_inst_->
                         super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    bVar1 = opt::Instruction::IsCommonDebugInstr(pIVar2);
    if (bVar1) {
      pIVar2 = this->debug_info_none_inst_;
      pIVar3 = context(this);
      IRContext::module(pIVar3);
      Module::ext_inst_debuginfo_begin((Module *)local_50);
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)local_50);
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                (&pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>,pIVar4);
    }
  }
  return;
}

Assistant:

void DebugInfoManager::AnalyzeDebugInsts(Module& module) {
  deref_operation_ = nullptr;
  debug_info_none_inst_ = nullptr;
  empty_debug_expr_inst_ = nullptr;
  module.ForEachInst([this](Instruction* cpi) { AnalyzeDebugInst(cpi); });

  // Move |empty_debug_expr_inst_| to the beginning of the debug instruction
  // list.
  if (empty_debug_expr_inst_ != nullptr &&
      empty_debug_expr_inst_->PreviousNode() != nullptr &&
      empty_debug_expr_inst_->PreviousNode()->IsCommonDebugInstr()) {
    empty_debug_expr_inst_->InsertBefore(
        &*context()->module()->ext_inst_debuginfo_begin());
  }

  // Move |debug_info_none_inst_| to the beginning of the debug instruction
  // list.
  if (debug_info_none_inst_ != nullptr &&
      debug_info_none_inst_->PreviousNode() != nullptr &&
      debug_info_none_inst_->PreviousNode()->IsCommonDebugInstr()) {
    debug_info_none_inst_->InsertBefore(
        &*context()->module()->ext_inst_debuginfo_begin());
  }
}